

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  pointer pbVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  string *psVar6;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  long lVar9;
  pointer pbVar10;
  cmTargetInternalPointer *this_01;
  cmStringRange cVar11;
  cmBacktraceRange cVar12;
  string configUpper;
  string property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string propName;
  string propValue;
  string local_50;
  
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[0] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[2] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<5UL>._M_w[4] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->InstallPath)._M_dataplus._M_p = (pointer)&(this->InstallPath).field_2;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)&(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  this_01 = &this->Internal;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TLLCommands).
  super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PostBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PreLinkCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PreBuildCommands).super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OriginalLinkLibraries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmTargetInternalPointer::cmTargetInternalPointer(this_01);
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  this->IsGeneratorProvided = false;
  std::__cxx11::string::_M_assign((string *)&this->Name);
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget = vis - VisibilityImported < 2;
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configUpper,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&property);
  psVar6 = cmMakefile::GetSafeDefinition(mf,&configUpper);
  this->DLLPlatform = psVar6->_M_string_length != 0;
  std::__cxx11::string::~string((string *)&configUpper);
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configUpper,"CMAKE_SYSTEM_NAME",(allocator<char> *)&property);
  psVar6 = cmMakefile::GetSafeDefinition(this_00,&configUpper);
  bVar3 = std::operator==(psVar6,"Android");
  this->IsAndroid = bVar3;
  std::__cxx11::string::~string((string *)&configUpper);
  if ((this->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_API",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_API_MIN",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_ARCH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_STL_TYPE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_SKIP_ANT_STEP",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_PROCESS_MAX",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_PROGUARD",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_PROGUARD_CONFIG_PATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_SECURE_PROPS_PATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_NATIVE_LIB_DIRECTORIES",(allocator<char> *)&property)
    ;
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_NATIVE_LIB_DEPENDENCIES",(allocator<char> *)&property
              );
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_JAVA_SOURCE_DIR",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_JAR_DIRECTORIES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_JAR_DEPENDENCIES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_ASSETS_DIRECTORIES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_ANT_ADDITIONAL_OPTIONS",(allocator<char> *)&property)
    ;
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_RPATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INSTALL_NAME_DIR",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INSTALL_RPATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,"");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INTERPROCEDURAL_OPTIMIZATION",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"SKIP_BUILD_RPATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ARCHIVE_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LIBRARY_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"RUNTIME_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"PDB_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Fortran_FORMAT",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Fortran_MODULE_DIRECTORY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Fortran_COMPILER_LAUNCHER",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"GNUtoMS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"OSX_ARCHITECTURES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"IOS_INSTALL_COMBINED",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOUIC",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTORCC",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOGEN_PARALLEL",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_COMPILER_PREDEFINES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_DEPEND_FILTERS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_MACRO_NAMES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_MOC_OPTIONS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOUIC_OPTIONS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOUIC_SEARCH_PATHS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTORCC_OPTIONS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_DEPENDS_NO_SHARED",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"WIN32_EXECUTABLE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"MACOSX_BUNDLE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"MACOSX_RPATH",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"NO_SYSTEM_FROM_IMPORTED",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_WITH_INSTALL_NAME_DIR",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_CLANG_TIDY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_COMPILER_LAUNCHER",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_CPPLINT",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_CPPCHECK",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_INCLUDE_WHAT_YOU_USE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_WHAT_YOU_USE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_STANDARD",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_STANDARD_REQUIRED",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_EXTENSIONS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_CLANG_TIDY",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_COMPILER_LAUNCHER",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_CPPLINT",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_CPPCHECK",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_INCLUDE_WHAT_YOU_USE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_STANDARD",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_STANDARD_REQUIRED",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_EXTENSIONS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_STANDARD",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_STANDARD_REQUIRED",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_EXTENSIONS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_COMPILER_LAUNCHER",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_SEARCH_START_STATIC",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_SEARCH_END_STATIC",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"FOLDER",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,mf,&configNames,true);
  std::__cxx11::string::~string((string *)&local_50);
  pbVar2 = configNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this->TargetTypeValue != UTILITY) {
    for (pbVar10 = configNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
        pbVar10 = pbVar10 + 1) {
      cmsys::SystemTools::UpperCase(&configUpper,pbVar10);
      for (lVar9 = 0; lVar9 != 0x38; lVar9 = lVar9 + 8) {
        pcVar7 = *(char **)((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*)
                                   ::configProps + lVar9);
        if (this->TargetTypeValue == INTERFACE_LIBRARY) {
          iVar5 = strcmp(pcVar7,"MAP_IMPORTED_CONFIG_");
          if (iVar5 == 0) goto LAB_0019fe8b;
        }
        else {
LAB_0019fe8b:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&property,pcVar7,(allocator<char> *)&propName);
          std::__cxx11::string::append((string *)&property);
          SetPropertyDefault(this,&property,(char *)0x0);
          std::__cxx11::string::~string((string *)&property);
        }
      }
      if ((this->TargetTypeValue != EXECUTABLE) && (this->TargetTypeValue != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&property,pbVar10);
        std::__cxx11::string::append((char *)&property);
        SetPropertyDefault(this,&property,(char *)0x0);
        std::__cxx11::string::~string((string *)&property);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
  }
  cmMakefile::GetBacktrace((cmMakefile *)&configUpper);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &this->Backtrace,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &configUpper);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&configUpper._M_string_length);
  if (this->IsImportedTarget == false) {
    cVar11 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar12 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01->Pointer
               ,(this_01->Pointer->IncludeDirectoriesEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,cVar11.Begin._M_current,
               cVar11.End._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &this_01->Pointer->IncludeDirectoriesBacktraces,
               (this_01->Pointer->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar12.Begin._M_current,cVar12.End._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&configUpper,&(this->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )configUpper.field_2._8_8_,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&configUpper._M_string_length);
    cVar11 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    cVar12 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this_01->Pointer->CompileOptionsEntries,
               (this_01->Pointer->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar11.Begin._M_current,
               cVar11.End._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &this_01->Pointer->CompileOptionsBacktraces,
               (this_01->Pointer->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar12.Begin._M_current,cVar12.End._M_current);
    cVar11 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_(this->Makefile);
    cVar12 = cmMakefile::GetLinkOptionsBacktraces(this->Makefile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this_01->Pointer->LinkOptionsEntries,
               (this_01->Pointer->LinkOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar11.Begin._M_current,
               cVar11.End._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &this_01->Pointer->LinkOptionsBacktraces,
               (this_01->Pointer->LinkOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar12.Begin._M_current,cVar12.End._M_current);
    cVar11 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_(this->Makefile);
    cVar12 = cmMakefile::GetLinkDirectoriesBacktraces(this->Makefile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this_01->Pointer->LinkDirectoriesEntries,
               (this_01->Pointer->LinkDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar11.Begin._M_current,
               cVar11.End._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &this_01->Pointer->LinkDirectoriesBacktraces,
               (this_01->Pointer->LinkDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar12.Begin._M_current,cVar12.End._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&configUpper);
  }
  TVar4 = this->TargetTypeValue;
  if ((TVar4 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_VISIBILITY_PRESET",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_VISIBILITY_PRESET",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_VISIBILITY_PRESET",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"VISIBILITY_INLINES_HIDDEN",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar4 = this->TargetTypeValue;
    if (TVar4 == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configUpper,"ANDROID_GUI",(allocator<char> *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configUpper,"CROSSCOMPILING_EMULATOR",(allocator<char> *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configUpper,"ENABLE_EXPORTS",(allocator<char> *)&property);
      SetPropertyDefault(this,&configUpper,(char *)0x0);
      std::__cxx11::string::~string((string *)&configUpper);
      TVar4 = this->TargetTypeValue;
    }
  }
  if ((TVar4 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&property);
    SetProperty(this,&configUpper,"True");
    std::__cxx11::string::~string((string *)&configUpper);
    TVar4 = this->TargetTypeValue;
  }
  if ((TVar4 & ~SHARED_LIBRARY) == EXECUTABLE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"WINDOWS_EXPORT_ALL_SYMBOLS",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar4 = this->TargetTypeValue;
  }
  if ((TVar4 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  TVar4 = this->TargetTypeValue;
  if (TVar4 == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
    TVar4 = this->TargetTypeValue;
    if (TVar4 == INTERFACE_LIBRARY) goto LAB_0019ff45;
  }
  if (TVar4 == UTILITY) {
LAB_0019fc56:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"DOTNET_TARGET_FRAMEWORK_VERSION",(allocator<char> *)&property
              );
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar4 = this->TargetTypeValue;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"JOB_POOL_COMPILE",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"JOB_POOL_LINK",(allocator<char> *)&property);
    SetPropertyDefault(this,&configUpper,(char *)0x0);
    std::__cxx11::string::~string((string *)&configUpper);
    TVar4 = this->TargetTypeValue;
    if ((int)TVar4 < 6) goto LAB_0019fc56;
  }
  if ((TVar4 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CMAKE_VS_GLOBALS",(allocator<char> *)&property);
    pcVar7 = cmMakefile::GetDefinition(mf,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    if (pcVar7 != (char *)0x0) {
      pcVar8 = cmMakefile::GetGlobalGenerator(mf);
      (*pcVar8->_vptr_cmGlobalGenerator[3])(&configUpper,pcVar8);
      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                        (&configUpper,(char (*) [14])"Visual Studio");
      if (bVar3) {
        props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&property,pcVar7,(allocator<char> *)&propName);
        cmSystemTools::ExpandListArgument(&property,&props,false);
        std::__cxx11::string::~string((string *)&property);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&property,"VS_GLOBAL_",(allocator<char> *)&propName);
        pbVar2 = props.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar10 = props.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar2;
            pbVar10 = pbVar10 + 1) {
          lVar9 = std::__cxx11::string::find((char)pbVar10,0x3d);
          if (lVar9 != -1) {
            std::__cxx11::string::substr((ulong)&propValue,(ulong)pbVar10);
            std::operator+(&propName,&property,&propValue);
            std::__cxx11::string::~string((string *)&propValue);
            std::__cxx11::string::substr((ulong)&propValue,(ulong)pbVar10);
            SetPropertyDefault(this,&propName,propValue._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&propValue);
            std::__cxx11::string::~string((string *)&propName);
          }
        }
        std::__cxx11::string::~string((string *)&property);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&props);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
  }
LAB_0019ff45:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configNames);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->IsGeneratorProvided = false;
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    !this->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    (this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME") == "Android");

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", nullptr);
    this->SetPropertyDefault("ANDROID_API_MIN", nullptr);
    this->SetPropertyDefault("ANDROID_ARCH", nullptr);
    this->SetPropertyDefault("ANDROID_STL_TYPE", nullptr);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", nullptr);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", nullptr);
    this->SetPropertyDefault("ANDROID_PROGUARD", nullptr);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", nullptr);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", nullptr);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", nullptr);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", nullptr);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", nullptr);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", nullptr);
    this->SetPropertyDefault("BUILD_RPATH", nullptr);
    this->SetPropertyDefault("BUILD_RPATH_USE_ORIGIN", nullptr);
    this->SetPropertyDefault("INSTALL_NAME_DIR", nullptr);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", nullptr);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("Fortran_FORMAT", nullptr);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", nullptr);
    this->SetPropertyDefault("Fortran_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("GNUtoMS", nullptr);
    this->SetPropertyDefault("OSX_ARCHITECTURES", nullptr);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", nullptr);
    this->SetPropertyDefault("AUTOMOC", nullptr);
    this->SetPropertyDefault("AUTOUIC", nullptr);
    this->SetPropertyDefault("AUTORCC", nullptr);
    this->SetPropertyDefault("AUTOGEN_ORIGIN_DEPENDS", nullptr);
    this->SetPropertyDefault("AUTOGEN_PARALLEL", nullptr);
    this->SetPropertyDefault("AUTOMOC_COMPILER_PREDEFINES", nullptr);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", nullptr);
    this->SetPropertyDefault("AUTOMOC_MACRO_NAMES", nullptr);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", nullptr);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", nullptr);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", nullptr);
    this->SetPropertyDefault("AUTORCC_OPTIONS", nullptr);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", nullptr);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", nullptr);
    this->SetPropertyDefault("WIN32_EXECUTABLE", nullptr);
    this->SetPropertyDefault("MACOSX_BUNDLE", nullptr);
    this->SetPropertyDefault("MACOSX_RPATH", nullptr);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", nullptr);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", nullptr);
    this->SetPropertyDefault("C_CLANG_TIDY", nullptr);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("C_CPPLINT", nullptr);
    this->SetPropertyDefault("C_CPPCHECK", nullptr);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("C_STANDARD", nullptr);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("C_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CXX_CLANG_TIDY", nullptr);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("CXX_CPPLINT", nullptr);
    this->SetPropertyDefault("CXX_CPPCHECK", nullptr);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("CXX_STANDARD", nullptr);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("CXX_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CUDA_STANDARD", nullptr);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("CUDA_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("CUDA_SEPARABLE_COMPILATION", nullptr);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", nullptr);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", nullptr);
    this->SetPropertyDefault("FOLDER", nullptr);
#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      this->SetPropertyDefault("XCODE_SCHEME_ADDRESS_SANITIZER", nullptr);
      this->SetPropertyDefault(
        "XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_THREAD_SANITIZER", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_THREAD_SANITIZER_STOP", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER",
                               nullptr);
      this->SetPropertyDefault(
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_SCRIBBLE", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_GUARD_EDGES", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_GUARD_MALLOC", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_ZOMBIE_OBJECTS", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_STACK", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS", nullptr);
    }
#endif
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = prop;
        property += configUpper;
        this->SetPropertyDefault(property, nullptr);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(configName);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, nullptr);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentCompileOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentCompileOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(),
      parentCompileOptions.begin(), parentCompileOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(),
      parentCompileOptionsBts.begin(), parentCompileOptionsBts.end());

    const cmStringRange parentLinkOptions =
      this->Makefile->GetLinkOptionsEntries();
    const cmBacktraceRange parentLinkOptionsBts =
      this->Makefile->GetLinkOptionsBacktraces();

    this->Internal->LinkOptionsEntries.insert(
      this->Internal->LinkOptionsEntries.end(), parentLinkOptions.begin(),
      parentLinkOptions.end());
    this->Internal->LinkOptionsBacktraces.insert(
      this->Internal->LinkOptionsBacktraces.end(),
      parentLinkOptionsBts.begin(), parentLinkOptionsBts.end());

    const cmStringRange parentLinkDirectories =
      this->Makefile->GetLinkDirectoriesEntries();
    const cmBacktraceRange parentLinkDirectoriesBts =
      this->Makefile->GetLinkDirectoriesBacktraces();

    this->Internal->LinkDirectoriesEntries.insert(
      this->Internal->LinkDirectoriesEntries.end(),
      parentLinkDirectories.begin(), parentLinkDirectories.end());
    this->Internal->LinkDirectoriesBacktraces.insert(
      this->Internal->LinkDirectoriesBacktraces.end(),
      parentLinkDirectoriesBts.begin(), parentLinkDirectoriesBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", nullptr);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", nullptr);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", nullptr);
    this->SetPropertyDefault("ENABLE_EXPORTS", nullptr);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", nullptr);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", nullptr);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", nullptr);
    this->SetPropertyDefault("JOB_POOL_LINK", nullptr);
  }

  if (this->TargetTypeValue <= cmStateEnums::UTILITY) {
    this->SetPropertyDefault("DOTNET_TARGET_FRAMEWORK_VERSION", nullptr);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {

    // check for "CMAKE_VS_GLOBALS" variable and set up target properties
    // if any
    const char* globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
    if (globals) {
      const std::string genName = mf->GetGlobalGenerator()->GetName();
      if (cmHasLiteralPrefix(genName, "Visual Studio")) {
        std::vector<std::string> props;
        cmSystemTools::ExpandListArgument(globals, props);
        const std::string vsGlobal = "VS_GLOBAL_";
        for (const std::string& i : props) {
          // split NAME=VALUE
          const std::string::size_type assignment = i.find('=');
          if (assignment != std::string::npos) {
            const std::string propName = vsGlobal + i.substr(0, assignment);
            const std::string propValue = i.substr(assignment + 1);
            this->SetPropertyDefault(propName, propValue.c_str());
          }
        }
      }
    }
  }
}